

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * chaiscript::exception::eval_error::format_filename
                   (string *__return_storage_ptr__,string *t_fname)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)t_fname);
  poVar2 = local_190;
  if (iVar1 == 0) {
    lVar3 = 0x12;
    pcVar4 = "during evaluation ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"in \'",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(t_fname->_M_dataplus)._M_p,t_fname->_M_string_length);
    lVar3 = 2;
    pcVar4 = "\' ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_filename(const std::string &t_fname)
      {
        std::stringstream ss;

        if (t_fname != "__EVAL__")
        {
          ss << "in '" << t_fname << "' ";
        } else {
          ss << "during evaluation ";
        }

        return ss.str();
      }